

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O2

SmallVector<spirv_cross::SPIRBlock::Case,_8UL> * __thiscall
spirv_cross::SmallVector<spirv_cross::SPIRBlock::Case,_8UL>::operator=
          (SmallVector<spirv_cross::SPIRBlock::Case,_8UL> *this,
          SmallVector<spirv_cross::SPIRBlock::Case,_8UL> *other)

{
  ulong uVar1;
  size_t i;
  ulong uVar2;
  
  if (this != other) {
    (this->super_VectorView<spirv_cross::SPIRBlock::Case>).buffer_size = 0;
    reserve(this,(other->super_VectorView<spirv_cross::SPIRBlock::Case>).buffer_size);
    for (uVar2 = 0; uVar1 = (other->super_VectorView<spirv_cross::SPIRBlock::Case>).buffer_size,
        uVar2 < uVar1; uVar2 = uVar2 + 1) {
      (this->super_VectorView<spirv_cross::SPIRBlock::Case>).ptr[uVar2] =
           (other->super_VectorView<spirv_cross::SPIRBlock::Case>).ptr[uVar2];
    }
    (this->super_VectorView<spirv_cross::SPIRBlock::Case>).buffer_size = uVar1;
  }
  return this;
}

Assistant:

SmallVector &operator=(const SmallVector &other) SPIRV_CROSS_NOEXCEPT
	{
		if (this == &other)
			return *this;

		clear();
		reserve(other.buffer_size);
		for (size_t i = 0; i < other.buffer_size; i++)
			new (&this->ptr[i]) T(other.ptr[i]);
		this->buffer_size = other.buffer_size;
		return *this;
	}